

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void presolve::HPresolve::debug(HighsLp *lp,HighsOptions *options)

{
  size_t sVar1;
  vector<int,_std::allocator<int>_> *Astart;
  vector<int,_std::allocator<int>_> *Aindex;
  vector<double,_std::allocator<double>_> *Avalue;
  int iVar2;
  size_t sVar3;
  HighsLp *pHVar4;
  bool bVar5;
  HighsModelStatus HVar6;
  HighsInt i_1;
  HighsInt i;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  allocator local_6941;
  ulong local_6940;
  size_t reductionLim;
  HighsLp *local_6930;
  vector<int,_std::allocator<int>_> Aend;
  HighsSolution sol;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> flagRow;
  vector<int,_std::allocator<int>_> flagCol;
  HighsBasis temp_basis;
  HighsBasis basis;
  HighsSolution temp_sol;
  HighsSolution reducedsol;
  KktInfo kktinfo;
  HighsPostsolveStack tmp;
  string local_6578;
  HighsBasis reducedbasis;
  HighsPostsolveStack postsolve_stack;
  HighsLp model;
  State local_6080;
  HPresolve presolve;
  HighsLp local_5920;
  HighsLp local_5588;
  Highs highs;
  
  reducedsol.value_valid = false;
  reducedsol.dual_valid = false;
  reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsBasis::HighsBasis(&reducedbasis);
  sol.value_valid = false;
  sol.dual_valid = false;
  sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HighsBasis::HighsBasis(&basis);
  HighsLp::HighsLp(&model,lp);
  highs._vptr_Highs._0_4_ = (uint)highs._vptr_Highs & 0xffffff00;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
            (&model.integrality_,(long)lp->num_col_,(value_type *)&highs);
  postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postsolve_stack.debug_prev_row_upper = 0.0;
  postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  postsolve_stack.debug_prev_col_upper = 0.0;
  postsolve_stack.debug_prev_row_lower = 0.0;
  postsolve_stack.debug_prev_numreductions = 0;
  postsolve_stack.debug_prev_col_lower = 0.0;
  memset(&postsolve_stack.reductions,0,0x90);
  postsolve_stack.origNumCol = -1;
  postsolve_stack.origNumRow = -1;
  HighsPostsolveStack::initializeIndexMaps(&postsolve_stack,lp->num_row_,lp->num_col_);
  HPresolve(&presolve);
  okSetInput(&presolve,&model,options,(options->super_HighsOptionsStruct).presolve_reduction_limit,
             (HighsTimer *)0x0);
  HVar6 = run(&presolve,&postsolve_stack);
  if (HVar6 == kMin) {
    Highs::Highs(&highs);
    HighsLp::HighsLp(&local_5920,&model);
    Highs::passModel(&highs,&local_5920);
    HighsLp::~HighsLp(&local_5920);
    Highs::passOptions(&highs,options);
    std::__cxx11::string::string((string *)&tmp,"presolve",(allocator *)&local_6080);
    Highs::setOptionValue(&highs,(string *)&tmp,&::kHighsOffString_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmp);
    Highs::run(&highs);
    if (highs.model_status_ == kOptimal) {
      HighsSolution::operator=(&reducedsol,&highs.solution_);
      HighsBasis::operator=(&reducedbasis,&highs.basis_);
      Highs::~Highs(&highs);
      ~HPresolve(&presolve);
      HighsLp::operator=(&model,lp);
      HighsSolution::operator=(&sol,&reducedsol);
      HighsBasis::operator=(&basis,&reducedbasis);
      HighsPostsolveStack::undo(&postsolve_stack,options,&sol,&basis,-1);
      refineBasis(lp,&sol,&basis);
      calculateRowValuesQuad(&model,&sol,-1);
      highs._vptr_Highs._0_4_ = 1;
      std::vector<int,_std::allocator<int>_>::vector
                (&flagCol,(long)lp->num_col_,(value_type_conflict2 *)&highs,
                 (allocator_type *)&presolve);
      highs._vptr_Highs._0_4_ = 1;
      std::vector<int,_std::allocator<int>_>::vector
                (&flagRow,(long)lp->num_row_,(value_type_conflict2 *)&highs,
                 (allocator_type *)&presolve);
      Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      dev_kkt_check::initInfo();
      local_6930 = lp;
      std::vector<int,std::allocator<int>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&Aend,
                 model.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,
                 model.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      Astart = &model.a_matrix_.start_;
      Aindex = &model.a_matrix_.index_;
      Avalue = &model.a_matrix_.value_;
      highsSparseTranspose
                (model.num_row_,model.num_col_,Astart,Aindex,Avalue,&ARstart,&ARindex,&ARvalue);
      local_6080.rowUpper = &model.row_upper_;
      local_6080.Aend = &Aend;
      local_6080.colCost = &model.col_cost_;
      local_6080.colLower = &model.col_lower_;
      local_6080.colUpper = &model.col_upper_;
      local_6080.rowLower = &model.row_lower_;
      local_6080.flagCol = &flagCol;
      local_6080.flagRow = &flagRow;
      local_6080.colValue = &sol.col_value;
      local_6080.colDual = &sol.col_dual;
      local_6080.rowValue = &sol.row_value;
      local_6080.rowDual = &sol.row_dual;
      local_6080.col_status = &basis.col_status;
      local_6080.row_status = &basis.row_status;
      local_6080.Astart = Astart;
      local_6080.Aindex = Aindex;
      local_6080.Avalue = Avalue;
      local_6080.ARstart = &ARstart;
      local_6080.ARindex = &ARindex;
      local_6080.ARvalue = &ARvalue;
      bVar5 = dev_kkt_check::checkKkt(&local_6080,&kktinfo);
      if ((bVar5) && (kktinfo.pass_bfs == true)) {
        puts("kkt check of postsolved solution and basis passed");
      }
      else {
        local_6940 = (long)postsolve_stack.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)postsolve_stack.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
        reductionLim = local_6940 >> 1;
        sVar8 = 0;
        do {
          pHVar4 = local_6930;
          HighsLp::operator=(&model,local_6930);
          highs._vptr_Highs._0_4_ = (uint)highs._vptr_Highs & 0xffffff00;
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
                    (&model.integrality_,(long)pHVar4->num_col_,(value_type *)&highs);
          HPresolve((HPresolve *)&highs);
          okSetInput((HPresolve *)&highs,&model,options,
                     (options->super_HighsOptionsStruct).presolve_reduction_limit,(HighsTimer *)0x0)
          ;
          computeIntermediateMatrix((HPresolve *)&highs,&flagRow,&flagCol,&reductionLim);
          ~HPresolve((HPresolve *)&highs);
          pHVar4 = local_6930;
          HighsLp::operator=(&model,local_6930);
          highs._vptr_Highs._0_4_ = (uint)highs._vptr_Highs & 0xffffff00;
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
                    (&model.integrality_,(long)pHVar4->num_col_,(value_type *)&highs);
          HPresolve(&presolve);
          okSetInput(&presolve,&model,options,
                     (options->super_HighsOptionsStruct).presolve_reduction_limit,(HighsTimer *)0x0)
          ;
          tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          tmp.debug_prev_row_upper = 0.0;
          tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tmp.debug_prev_col_upper = 0.0;
          tmp.debug_prev_row_lower = 0.0;
          tmp.debug_prev_numreductions = 0;
          tmp.debug_prev_col_lower = 0.0;
          memset(&tmp.reductions,0,0x90);
          tmp.origNumCol = -1;
          tmp.origNumRow = -1;
          HighsPostsolveStack::initializeIndexMaps(&tmp,model.num_row_,model.num_col_);
          sVar3 = reductionLim;
          presolve.reductionLimit = reductionLim;
          run(&presolve,&tmp);
          HighsSolution::operator=(&sol,&reducedsol);
          HighsBasis::operator=(&basis,&reducedbasis);
          HighsPostsolveStack::undoUntil
                    (&postsolve_stack,options,&sol,&basis,
                     (long)tmp.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tmp.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
          HighsBasis::HighsBasis(&temp_basis);
          temp_sol.value_valid = false;
          temp_sol.dual_valid = false;
          temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
                    (&temp_basis.col_status,(long)model.num_col_);
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.col_dual,(long)model.num_col_);
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.col_value,(long)model.num_col_);
          for (uVar7 = 0; (uint)model.num_col_ != uVar7; uVar7 = uVar7 + 1) {
            iVar2 = tmp.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
            temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
            temp_basis.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 basis.col_status.
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
          }
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
                    (&temp_basis.row_status,(long)model.num_row_);
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.row_dual,(long)model.num_row_);
          for (uVar7 = 0; (uint)model.num_row_ != uVar7; uVar7 = uVar7 + 1) {
            iVar2 = tmp.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
            temp_basis.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 basis.row_status.
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
          }
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.row_value,(long)model.num_row_);
          calculateRowValuesQuad(&model,&sol,-1);
          temp_basis.valid = true;
          temp_basis.useful = true;
          refineBasis(&model,&temp_sol,&temp_basis);
          Highs::Highs(&highs);
          Highs::passOptions(&highs,options);
          HighsLp::HighsLp(&local_5588,&model);
          Highs::passModel(&highs,&local_5588);
          HighsLp::~HighsLp(&local_5588);
          std::__cxx11::string::assign((char *)&temp_basis.debug_origin_name);
          std::__cxx11::string::string((string *)&local_6578,"",&local_6941);
          Highs::setBasis(&highs,&temp_basis,&local_6578);
          std::__cxx11::string::~string((string *)&local_6578);
          Highs::run(&highs);
          printf("simplex iterations with postsolved basis: %d\n",
                 (ulong)(uint)highs.info_.super_HighsInfoStruct.simplex_iteration_count);
          sVar1 = local_6940 - 1;
          sVar9 = sVar8;
          if (sVar8 != sVar1) {
            sVar9 = sVar3;
            if (highs.info_.super_HighsInfoStruct.simplex_iteration_count == 0) {
              sVar9 = sVar8;
              local_6940 = sVar3;
            }
            reductionLim = sVar9 + local_6940 >> 1;
            printf("binary search ongoing: good=%zu, bad=%zu\n",local_6940,sVar9);
          }
          Highs::~Highs(&highs);
          HighsSolution::~HighsSolution(&temp_sol);
          HighsBasis::~HighsBasis(&temp_basis);
          HighsPostsolveStack::~HighsPostsolveStack(&tmp);
          ~HPresolve(&presolve);
          bVar5 = sVar8 != sVar1;
          sVar8 = sVar9;
        } while (bVar5);
        printf("binary search finished: good=%zu, bad=%zu\n",local_6940,sVar9);
      }
      std::
      _Rb_tree<presolve::dev_kkt_check::KktCondition,_std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>,_std::_Select1st<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
      ::~_Rb_tree((_Rb_tree<presolve::dev_kkt_check::KktCondition,_std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>,_std::_Select1st<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                   *)&kktinfo);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ARvalue.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&ARindex.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&ARstart.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&Aend.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&flagRow.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&flagCol.super__Vector_base<int,_std::allocator<int>_>);
      goto LAB_00311a5a;
    }
    Highs::~Highs(&highs);
  }
  ~HPresolve(&presolve);
LAB_00311a5a:
  HighsPostsolveStack::~HighsPostsolveStack(&postsolve_stack);
  HighsLp::~HighsLp(&model);
  HighsBasis::~HighsBasis(&basis);
  HighsSolution::~HighsSolution(&sol);
  HighsBasis::~HighsBasis(&reducedbasis);
  HighsSolution::~HighsSolution(&reducedsol);
  return;
}

Assistant:

void HPresolve::debug(const HighsLp& lp, const HighsOptions& options) {
  HighsSolution reducedsol;
  HighsBasis reducedbasis;

  HighsSolution sol;
  HighsBasis basis;

  HighsLp model = lp;
  model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);

  HighsPostsolveStack postsolve_stack;
  postsolve_stack.initializeIndexMaps(lp.num_row_, lp.num_col_);
  {
    HPresolve presolve;
    presolve.okSetInput(model, options, options.presolve_reduction_limit);
    // presolve.setReductionLimit(1622017);
    if (presolve.run(postsolve_stack) != HighsModelStatus::kNotset) return;
    Highs highs;
    highs.passModel(model);
    highs.passOptions(options);
    highs.setOptionValue("presolve", kHighsOffString);
    highs.run();
    if (highs.getModelStatus() != HighsModelStatus::kOptimal) return;
    reducedsol = highs.getSolution();
    reducedbasis = highs.getBasis();
  }
  model = lp;
  sol = reducedsol;
  basis = reducedbasis;
  postsolve_stack.undo(options, sol, basis);
  refineBasis(lp, sol, basis);
  calculateRowValuesQuad(model, sol);
#if 0
  Highs highs;
  highs.passModel(model);
  highs.passOptions(options);
  highs.setSolution(sol);
  basis.debug_origin_name = "HPresolve::debug";
  highs.setBasis(basis);
  highs.run();
  return;
#endif
  std::vector<HighsInt> flagCol(lp.num_col_, 1);
  std::vector<HighsInt> flagRow(lp.num_row_, 1);
  std::vector<HighsInt> Aend;
  std::vector<HighsInt> ARstart;
  std::vector<HighsInt> ARindex;
  std::vector<double> ARvalue;
  dev_kkt_check::KktInfo kktinfo = dev_kkt_check::initInfo();
  Aend.assign(model.a_matrix_.start_.begin() + 1, model.a_matrix_.start_.end());
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart,
                       ARindex, ARvalue);
  dev_kkt_check::State state(
      model.num_col_, model.num_row_, model.a_matrix_.start_, Aend,
      model.a_matrix_.index_, model.a_matrix_.value_, ARstart, ARindex, ARvalue,
      model.col_cost_, model.col_lower_, model.col_upper_, model.row_lower_,
      model.row_upper_, flagCol, flagRow, sol.col_value, sol.col_dual,
      sol.row_value, sol.row_dual, basis.col_status, basis.row_status);
  bool checkResult = dev_kkt_check::checkKkt(state, kktinfo);
  if (checkResult && kktinfo.pass_bfs) {
    printf("kkt check of postsolved solution and basis passed\n");
    return;
  }
  size_t good = postsolve_stack.numReductions();
  size_t bad = 0;
  size_t reductionLim = (good + bad) / 2;

  // good = 1734357, bad = 1734289;
  // good = 1050606, bad = 1050605;
  // good = 1811527, bad = 1811526;
  // reductionLim = bad;
  do {
    model = lp;
    model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);

    {
      HPresolve presolve;
      presolve.okSetInput(model, options, options.presolve_reduction_limit);
      presolve.computeIntermediateMatrix(flagRow, flagCol, reductionLim);
    }
#if 1
    model = lp;
    model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);
    HPresolve presolve;
    presolve.okSetInput(model, options, options.presolve_reduction_limit);
    HighsPostsolveStack tmp;
    tmp.initializeIndexMaps(model.num_row_, model.num_col_);
    presolve.setReductionLimit(reductionLim);
    presolve.run(tmp);

    sol = reducedsol;
    basis = reducedbasis;
    postsolve_stack.undoUntil(options, sol, basis, tmp.numReductions());

    HighsBasis temp_basis;
    HighsSolution temp_sol;
    temp_basis.col_status.resize(model.num_col_);
    temp_sol.col_dual.resize(model.num_col_);
    temp_sol.col_value.resize(model.num_col_);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      temp_sol.col_dual[i] = sol.col_dual[tmp.getOrigColIndex(i)];
      temp_sol.col_value[i] = sol.col_value[tmp.getOrigColIndex(i)];
      temp_basis.col_status[i] = basis.col_status[tmp.getOrigColIndex(i)];
    }

    temp_basis.row_status.resize(model.num_row_);
    temp_sol.row_dual.resize(model.num_row_);
    for (HighsInt i = 0; i != model.num_row_; ++i) {
      temp_sol.row_dual[i] = sol.row_dual[tmp.getOrigRowIndex(i)];
      temp_basis.row_status[i] = basis.row_status[tmp.getOrigRowIndex(i)];
    }
    temp_sol.row_value.resize(model.num_row_);
    calculateRowValuesQuad(model, sol);
    temp_basis.valid = true;
    temp_basis.useful = true;
    refineBasis(model, temp_sol, temp_basis);
    Highs highs;
    highs.passOptions(options);
    highs.passModel(model);
    temp_basis.debug_origin_name = "HPresolve::debug";
    highs.setBasis(temp_basis);
    // highs.writeModel("model.mps");
    // highs.writeBasis("bad.bas");
    highs.run();
    printf("simplex iterations with postsolved basis: %" HIGHSINT_FORMAT "\n",
           highs.getInfo().simplex_iteration_count);
    checkResult = highs.getInfo().simplex_iteration_count == 0;
#else

    if (reductionLim == good) break;

    Aend.assign(model.a_matrix_.start_.begin() + 1,
                model.a_matrix_.start_.end());
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart, ARindex, ARvalue);
    sol = reducedsol;
    basis = reducedbasis;
    postsolve_stack.undoUntil(options, sol, basis, reductionLim);

    calculateRowValuesQuad(model, sol);
    kktinfo = dev_kkt_check::initInfo();
    checkResult = dev_kkt_check::checkKkt(state, kktinfo);
    checkResult = checkResult && kktinfo.pass_bfs;
#endif
    if (bad == good - 1) break;

    if (checkResult) {
      good = reductionLim;
    } else {
      bad = reductionLim;
    }
    reductionLim = (bad + good) / 2;
    printf("binary search ongoing: good=%zu, bad=%zu\n", good, bad);
  } while (true);

  printf("binary search finished: good=%zu, bad=%zu\n", good, bad);
  assert(false);
}